

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::App::help(string *__return_storage_ptr__,App *this,string *prev,AppFormatMode mode)

{
  App *this_00;
  bool bVar1;
  ulong uVar2;
  reference ppAVar3;
  element_type *peVar4;
  string local_f8 [36];
  undefined4 local_d4;
  string local_d0;
  undefined1 local_b0 [8];
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  AppFormatMode local_24;
  string *psStack_20;
  AppFormatMode mode_local;
  string *prev_local;
  App *this_local;
  
  local_24 = mode;
  psStack_20 = prev;
  prev_local = (string *)this;
  this_local = (App *)__return_storage_ptr__;
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    get_name_abi_cxx11_(&local_88,this);
    ::std::operator+(&local_68," ",&local_88);
    ::std::__cxx11::string::operator+=((string *)prev,(string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    get_name_abi_cxx11_(&local_48,this);
    ::std::__cxx11::string::operator=((string *)prev,(string *)&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  get_subcommands((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_b0,this);
  bVar1 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::empty
                    ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_b0);
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->formatter_);
    ::std::__cxx11::string::string(local_f8,(string *)prev);
    (*peVar4->_vptr_FormatterBase[2])(__return_storage_ptr__,peVar4,this,local_f8,(ulong)local_24);
    ::std::__cxx11::string::~string(local_f8);
  }
  else {
    ppAVar3 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::at
                        ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_b0,0);
    this_00 = *ppAVar3;
    ::std::__cxx11::string::string((string *)&local_d0,(string *)prev);
    help(__return_storage_ptr__,this_00,&local_d0,Normal);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  local_d4 = 1;
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string help(std::string prev = "", AppFormatMode mode = AppFormatMode::Normal) const {
        if(prev.empty())
            prev = get_name();
        else
            prev += " " + get_name();

        // Delegate to subcommand if needed
        auto selected_subcommands = get_subcommands();
        if(!selected_subcommands.empty())
            return selected_subcommands.at(0)->help(prev);
        else
            return formatter_->make_help(this, prev, mode);
    }